

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_winograd_transform_pack8.h
# Opt level: O0

void ncnn::conv3x3s1_winograd23_transform_output_pack8_avx
               (Mat *top_blob_tm,Mat *top_blob,Mat *bias,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  long lVar14;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  __m256 _out01;
  __m256 _out00;
  __m256 _tmp03;
  __m256 _tmp02;
  __m256 _tmp01;
  __m256 _tmp00;
  int m_3;
  __m256 _tmp1m;
  __m256 _tmp0m;
  __m256 _out0tm3;
  __m256 _out0tm2;
  __m256 _out0tm1;
  __m256 _out0tm0;
  int m_2;
  float *output0;
  float *output0_tm_3;
  float *output0_tm_2;
  float *output0_tm_1;
  float *output0_tm_0;
  int j;
  int i;
  float tmp [2] [4] [8];
  __m256 _bias0;
  Mat out0;
  Mat out0_tm;
  int p;
  float *biasptr;
  int tiles;
  int h_tiles;
  int w_tiles;
  int outch;
  int outh;
  int outw;
  Mat *m_1;
  Mat *m;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  int local_8c4;
  int local_7f4;
  undefined8 *local_7f0;
  undefined8 *local_7e8;
  undefined1 (*local_7e0) [32];
  undefined1 (*local_7d8) [32];
  undefined8 *local_7d0;
  int local_7c8;
  int local_7c4;
  undefined8 local_7c0 [35];
  undefined8 uStack_6a8;
  void *local_688;
  int *local_680;
  ulong local_678;
  undefined4 local_670;
  long *local_668;
  int local_660;
  int local_65c;
  int local_658;
  undefined4 local_654;
  undefined4 local_650;
  ulong local_648;
  void *local_640;
  int *local_638;
  ulong local_630;
  undefined4 local_628;
  long *local_620;
  int local_618;
  int local_614;
  int local_610;
  undefined4 local_60c;
  undefined4 local_608;
  ulong local_600;
  int local_5f4;
  long local_5f0;
  int local_5e8;
  int local_5e4;
  int local_5e0;
  int local_5dc;
  int local_5d8;
  int local_5d4;
  long *local_5c0;
  long *local_5b8;
  void **local_5b0;
  void **local_5a0;
  int local_580;
  undefined4 local_57c;
  void **local_578;
  int local_560;
  undefined4 local_55c;
  void **local_558;
  undefined1 local_54d;
  int local_54c;
  void **local_540;
  void **local_520;
  undefined1 local_50d;
  int local_50c;
  void **local_500;
  void *local_4d0;
  void *local_4c0;
  int local_4ac;
  void **local_4a8;
  undefined8 *local_4a0;
  undefined1 (*local_498) [32];
  undefined1 (*local_490) [32];
  undefined8 *local_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 *local_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 *local_410;
  undefined8 *local_408;
  undefined8 *local_400;
  undefined8 *local_3f8;
  undefined8 *local_3f0;
  undefined8 *local_3e8;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 *local_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 *local_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  long *local_c0;
  undefined4 local_b4;
  ulong local_b0;
  void *local_a8;
  undefined4 local_9c;
  int local_98;
  int local_94;
  void **local_90;
  long *local_88;
  undefined4 local_7c;
  ulong local_78;
  void *local_70;
  undefined4 local_64;
  int local_60;
  int local_5c;
  void **local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  
  local_5d4 = *(int *)((long)in_RSI + 0x2c);
  local_5d8 = (int)in_RSI[6];
  local_5dc = (int)in_RSI[7];
  local_5e0 = local_5d4 / 2;
  local_5e4 = local_5d8 / 2;
  local_5e8 = local_5e0 * local_5e4;
  local_5f0 = *in_RDX;
  local_5c0 = in_RSI;
  local_5b8 = in_RDI;
  for (local_5f4 = 0; local_5f4 < local_5dc; local_5f4 = local_5f4 + 1) {
    local_500 = &local_640;
    local_94 = *(int *)((long)local_5b8 + 0x2c);
    local_98 = (int)local_5b8[6];
    local_9c = *(undefined4 *)((long)local_5b8 + 0x34);
    local_a8 = (void *)(*local_5b8 + local_5b8[8] * (long)local_5f4 * local_5b8[2]);
    local_b0 = local_5b8[2];
    local_b4 = (undefined4)local_5b8[3];
    local_c0 = (long *)local_5b8[4];
    local_90 = &local_640;
    local_638 = (int *)0x0;
    local_60c = 1;
    local_38 = (long)local_94 * (long)local_98 * local_b0;
    local_600 = (local_38 + 0xfU & 0xfffffffffffffff0) / local_b0;
    local_618 = (int)local_5b8[5] + -1;
    if ((int)local_5b8[5] == 4) {
      local_600 = (long)*(int *)((long)local_5b8 + 0x2c) * (long)(int)local_5b8[6];
    }
    local_540 = &local_688;
    local_5c = *(int *)((long)local_5c0 + 0x2c);
    local_60 = (int)local_5c0[6];
    local_64 = *(undefined4 *)((long)local_5c0 + 0x34);
    local_70 = (void *)(*local_5c0 + local_5c0[8] * (long)local_5f4 * local_5c0[2]);
    local_78 = local_5c0[2];
    local_7c = (undefined4)local_5c0[3];
    local_88 = (long *)local_5c0[4];
    local_58 = &local_688;
    local_680 = (int *)0x0;
    local_654 = 1;
    local_48 = (long)local_5c * (long)local_60 * local_78;
    local_648 = (local_48 + 0xfU & 0xfffffffffffffff0) / local_78;
    local_660 = (int)local_5c0[5] + -1;
    if ((int)local_5c0[5] == 4) {
      local_648 = (long)*(int *)((long)local_5c0 + 0x2c) * (long)(int)local_5c0[6];
    }
    local_3c = 0x10;
    local_4c = 0x10;
    local_50c = local_5f4;
    local_50d = 1;
    local_54c = local_5f4;
    local_54d = 1;
    if (local_5f0 == 0) {
      local_e0 = 0;
      uStack_d8 = 0;
      uStack_d0 = 0;
      uStack_c8 = 0;
      local_a00 = 0;
      uStack_9f8 = 0;
      uStack_9f0 = 0;
      uStack_9e8 = 0;
    }
    else {
      local_3e8 = (undefined8 *)(local_5f0 + (long)(local_5f4 << 3) * 4);
      local_a00 = *local_3e8;
      uStack_9f8 = local_3e8[1];
      uStack_9f0 = local_3e8[2];
      uStack_9e8 = local_3e8[3];
    }
    local_7c0[0x20] = local_a00;
    local_7c0[0x21] = uStack_9f8;
    local_7c0[0x22] = uStack_9f0;
    uStack_6a8 = uStack_9e8;
    local_688 = local_70;
    local_678 = local_78;
    local_670 = local_7c;
    local_668 = local_88;
    local_65c = local_5c;
    local_658 = local_60;
    local_650 = local_64;
    local_640 = local_a8;
    local_630 = local_b0;
    local_628 = local_b4;
    local_620 = local_c0;
    local_614 = local_94;
    local_610 = local_98;
    local_608 = local_9c;
    for (local_7c4 = 0; local_7c4 < local_5e4; local_7c4 = local_7c4 + 1) {
      for (local_7c8 = 0; local_7c8 < local_5e0; local_7c8 = local_7c8 + 1) {
        local_520 = &local_640;
        local_7d0 = (undefined8 *)
                    ((long)local_640 + (long)((local_7c4 * local_5e0 + local_7c8) * 8) * 4);
        local_7d8 = (undefined1 (*) [32])((long)local_7d0 + (long)(local_5e8 << 3) * 4);
        local_7e0 = (undefined1 (*) [32])((long)local_7d0 + (long)(local_5e8 << 4) * 4);
        local_7e8 = (undefined8 *)((long)local_7d0 + (long)(local_5e8 * 0x18) * 4);
        local_4ac = local_7c4 << 1;
        local_4a8 = &local_688;
        local_7f0 = (undefined8 *)
                    ((long)local_688 +
                    (long)(local_7c8 << 4) * 4 + (long)local_65c * (long)local_4ac * local_678);
        for (local_7f4 = 0; local_7f4 < 4; local_7f4 = local_7f4 + 1) {
          local_488 = local_7d0;
          uVar1 = *local_7d0;
          uVar2 = local_7d0[1];
          uVar3 = local_7d0[2];
          uVar4 = local_7d0[3];
          local_490 = local_7d8;
          local_100 = *(undefined8 *)*local_7d8;
          uStack_f8 = *(undefined8 *)(*local_7d8 + 8);
          uStack_f0 = *(undefined8 *)(*local_7d8 + 0x10);
          uStack_e8 = *(undefined8 *)(*local_7d8 + 0x18);
          local_498 = local_7e0;
          local_120 = *(undefined8 *)*local_7e0;
          uStack_118 = *(undefined8 *)(*local_7e0 + 8);
          uStack_110 = *(undefined8 *)(*local_7e0 + 0x10);
          uStack_108 = *(undefined8 *)(*local_7e0 + 0x18);
          local_4a0 = local_7e8;
          uVar5 = *local_7e8;
          uVar6 = local_7e8[1];
          uVar7 = local_7e8[2];
          uVar8 = local_7e8[3];
          local_200._0_4_ = (float)uVar1;
          local_200._4_4_ = (float)((ulong)uVar1 >> 0x20);
          uStack_1f8._0_4_ = (float)uVar2;
          uStack_1f8._4_4_ = (float)((ulong)uVar2 >> 0x20);
          uStack_1f0._0_4_ = (float)uVar3;
          uStack_1f0._4_4_ = (float)((ulong)uVar3 >> 0x20);
          uStack_1e8._0_4_ = (float)uVar4;
          uStack_1e8._4_4_ = (float)((ulong)uVar4 >> 0x20);
          local_220._0_4_ = (float)local_100;
          local_220._4_4_ = (float)((ulong)local_100 >> 0x20);
          uStack_218._0_4_ = (float)uStack_f8;
          uStack_218._4_4_ = (float)((ulong)uStack_f8 >> 0x20);
          uStack_210._0_4_ = (float)uStack_f0;
          uStack_210._4_4_ = (float)((ulong)uStack_f0 >> 0x20);
          uStack_208._0_4_ = (float)uStack_e8;
          uStack_208._4_4_ = (float)((ulong)uStack_e8 >> 0x20);
          local_240 = (float)local_200 + (float)local_220;
          fStack_23c = local_200._4_4_ + local_220._4_4_;
          fStack_238 = (float)uStack_1f8 + (float)uStack_218;
          fStack_234 = uStack_1f8._4_4_ + uStack_218._4_4_;
          fStack_230 = (float)uStack_1f0 + (float)uStack_210;
          fStack_22c = uStack_1f0._4_4_ + uStack_210._4_4_;
          fStack_228 = (float)uStack_1e8 + (float)uStack_208;
          fStack_224 = uStack_1e8._4_4_ + uStack_208._4_4_;
          local_260._0_4_ = (float)local_120;
          local_260._4_4_ = (float)((ulong)local_120 >> 0x20);
          uStack_258._0_4_ = (float)uStack_118;
          uStack_258._4_4_ = (float)((ulong)uStack_118 >> 0x20);
          uStack_250._0_4_ = (float)uStack_110;
          uStack_250._4_4_ = (float)((ulong)uStack_110 >> 0x20);
          uStack_248._0_4_ = (float)uStack_108;
          uStack_248._4_4_ = (float)((ulong)uStack_108 >> 0x20);
          _local_280 = vsubps_avx(*local_7d8,*local_7e0);
          local_2a0._0_4_ = (float)uVar5;
          local_2a0._4_4_ = (float)((ulong)uVar5 >> 0x20);
          uStack_298._0_4_ = (float)uVar6;
          uStack_298._4_4_ = (float)((ulong)uVar6 >> 0x20);
          uStack_290._0_4_ = (float)uVar7;
          uStack_290._4_4_ = (float)((ulong)uVar7 >> 0x20);
          uStack_288._0_4_ = (float)uVar8;
          uStack_288._4_4_ = (float)((ulong)uVar8 >> 0x20);
          fVar15 = (float)local_280._0_4_ + (float)local_2a0;
          fVar16 = (float)local_280._4_4_ + local_2a0._4_4_;
          fVar17 = fStack_278 + (float)uStack_298;
          fVar18 = fStack_274 + uStack_298._4_4_;
          fVar19 = fStack_270 + (float)uStack_290;
          fVar20 = fStack_26c + uStack_290._4_4_;
          fVar21 = fStack_268 + (float)uStack_288;
          fVar22 = fStack_264 + uStack_288._4_4_;
          lVar14 = (long)local_7f4;
          local_168 = local_7c0 + lVar14 * 4;
          local_1a0 = CONCAT44(fStack_23c + local_260._4_4_,local_240 + (float)local_260);
          uVar9 = CONCAT44(fStack_234 + uStack_258._4_4_,fStack_238 + (float)uStack_258);
          uVar10 = CONCAT44(fStack_22c + uStack_250._4_4_,fStack_230 + (float)uStack_250);
          uVar11 = CONCAT44(fStack_224 + uStack_248._4_4_,fStack_228 + (float)uStack_248);
          local_2a0 = uVar5;
          uStack_298 = uVar6;
          uStack_290 = uVar7;
          uStack_288 = uVar8;
          local_260 = local_120;
          uStack_258 = uStack_118;
          uStack_250 = uStack_110;
          uStack_248 = uStack_108;
          local_220 = local_100;
          uStack_218 = uStack_f8;
          uStack_210 = uStack_f0;
          uStack_208 = uStack_e8;
          local_200 = uVar1;
          uStack_1f8 = uVar2;
          uStack_1f0 = uVar3;
          uStack_1e8 = uVar4;
          uStack_198 = uVar9;
          uStack_190 = uVar10;
          uStack_188 = uVar11;
          *local_168 = local_1a0;
          local_7c0[lVar14 * 4 + 1] = uVar9;
          local_7c0[lVar14 * 4 + 2] = uVar10;
          local_7c0[lVar14 * 4 + 3] = uVar11;
          lVar14 = (long)local_7f4;
          local_1a8 = local_7c0 + lVar14 * 4 + 0x10;
          local_1e0 = CONCAT44(fVar16,fVar15);
          uVar1 = CONCAT44(fVar18,fVar17);
          uVar2 = CONCAT44(fVar20,fVar19);
          uVar3 = CONCAT44(fVar22,fVar21);
          uStack_1d8 = uVar1;
          uStack_1d0 = uVar2;
          uStack_1c8 = uVar3;
          *local_1a8 = local_1e0;
          local_7c0[lVar14 * 4 + 0x11] = uVar1;
          local_7c0[lVar14 * 4 + 0x12] = uVar2;
          local_7c0[lVar14 * 4 + 0x13] = uVar3;
          local_7d0 = (undefined8 *)((long)local_7d0 + (long)(local_5e8 << 5) * 4);
          local_7d8 = (undefined1 (*) [32])(*local_7d8 + (long)(local_5e8 << 5) * 4);
          local_7e0 = (undefined1 (*) [32])(*local_7e0 + (long)(local_5e8 << 5) * 4);
          local_7e8 = (undefined8 *)((long)local_7e8 + (long)(local_5e8 << 5) * 4);
        }
        for (local_8c4 = 0; local_8c4 < 2; local_8c4 = local_8c4 + 1) {
          lVar14 = (long)local_8c4;
          local_3f0 = local_7c0 + lVar14 * 0x10;
          uVar1 = *local_3f0;
          uVar2 = local_7c0[lVar14 * 0x10 + 1];
          uVar3 = local_7c0[lVar14 * 0x10 + 2];
          uVar4 = local_7c0[lVar14 * 0x10 + 3];
          lVar14 = (long)local_8c4;
          local_3f8 = local_7c0 + lVar14 * 0x10 + 4;
          local_140 = *local_3f8;
          uStack_138 = local_7c0[lVar14 * 0x10 + 5];
          uStack_130 = local_7c0[lVar14 * 0x10 + 6];
          uStack_128 = local_7c0[lVar14 * 0x10 + 7];
          lVar14 = (long)local_8c4;
          local_400 = local_7c0 + lVar14 * 0x10 + 8;
          local_160 = *local_400;
          uStack_158 = local_7c0[lVar14 * 0x10 + 9];
          uStack_150 = local_7c0[lVar14 * 0x10 + 10];
          uStack_148 = local_7c0[lVar14 * 0x10 + 0xb];
          lVar14 = (long)local_8c4;
          local_408 = local_7c0 + lVar14 * 0x10 + 0xc;
          uVar5 = *local_408;
          uVar6 = local_7c0[lVar14 * 0x10 + 0xd];
          uVar7 = local_7c0[lVar14 * 0x10 + 0xe];
          uVar8 = local_7c0[lVar14 * 0x10 + 0xf];
          local_2c0._0_4_ = (float)uVar1;
          local_2c0._4_4_ = (float)((ulong)uVar1 >> 0x20);
          uStack_2b8._0_4_ = (float)uVar2;
          uStack_2b8._4_4_ = (float)((ulong)uVar2 >> 0x20);
          uStack_2b0._0_4_ = (float)uVar3;
          uStack_2b0._4_4_ = (float)((ulong)uVar3 >> 0x20);
          uStack_2a8._0_4_ = (float)uVar4;
          uStack_2a8._4_4_ = (float)((ulong)uVar4 >> 0x20);
          local_2e0._0_4_ = (float)local_140;
          local_2e0._4_4_ = (float)((ulong)local_140 >> 0x20);
          uStack_2d8._0_4_ = (float)uStack_138;
          uStack_2d8._4_4_ = (float)((ulong)uStack_138 >> 0x20);
          uStack_2d0._0_4_ = (float)uStack_130;
          uStack_2d0._4_4_ = (float)((ulong)uStack_130 >> 0x20);
          uStack_2c8._0_4_ = (float)uStack_128;
          uStack_2c8._4_4_ = (float)((ulong)uStack_128 >> 0x20);
          local_300 = (float)local_2c0 + (float)local_2e0;
          fStack_2fc = local_2c0._4_4_ + local_2e0._4_4_;
          fStack_2f8 = (float)uStack_2b8 + (float)uStack_2d8;
          fStack_2f4 = uStack_2b8._4_4_ + uStack_2d8._4_4_;
          fStack_2f0 = (float)uStack_2b0 + (float)uStack_2d0;
          fStack_2ec = uStack_2b0._4_4_ + uStack_2d0._4_4_;
          fStack_2e8 = (float)uStack_2a8 + (float)uStack_2c8;
          fStack_2e4 = uStack_2a8._4_4_ + uStack_2c8._4_4_;
          local_320._0_4_ = (float)local_160;
          local_320._4_4_ = (float)((ulong)local_160 >> 0x20);
          uStack_318._0_4_ = (float)uStack_158;
          uStack_318._4_4_ = (float)((ulong)uStack_158 >> 0x20);
          uStack_310._0_4_ = (float)uStack_150;
          uStack_310._4_4_ = (float)((ulong)uStack_150 >> 0x20);
          uStack_308._0_4_ = (float)uStack_148;
          uStack_308._4_4_ = (float)((ulong)uStack_148 >> 0x20);
          local_360 = local_300 + (float)local_320;
          fStack_35c = fStack_2fc + local_320._4_4_;
          fStack_358 = fStack_2f8 + (float)uStack_318;
          fStack_354 = fStack_2f4 + uStack_318._4_4_;
          fStack_350 = fStack_2f0 + (float)uStack_310;
          fStack_34c = fStack_2ec + uStack_310._4_4_;
          fStack_348 = fStack_2e8 + (float)uStack_308;
          fStack_344 = fStack_2e4 + uStack_308._4_4_;
          local_340._0_4_ = (float)local_7c0[0x20];
          local_340._4_4_ = (float)((ulong)local_7c0[0x20] >> 0x20);
          uStack_338._0_4_ = (float)local_7c0[0x21];
          uStack_338._4_4_ = (float)((ulong)local_7c0[0x21] >> 0x20);
          uStack_330._0_4_ = (float)local_7c0[0x22];
          uStack_330._4_4_ = (float)((ulong)local_7c0[0x22] >> 0x20);
          uStack_328._0_4_ = (float)uStack_6a8;
          uStack_328._4_4_ = (float)((ulong)uStack_6a8 >> 0x20);
          local_3c0 = local_7c0[0x20];
          uStack_3b8 = local_7c0[0x21];
          uStack_3b0 = local_7c0[0x22];
          uStack_3a8 = uStack_6a8;
          auVar13._8_8_ = uStack_138;
          auVar13._0_8_ = local_140;
          auVar13._16_8_ = uStack_130;
          auVar13._24_8_ = uStack_128;
          auVar12._8_8_ = uStack_158;
          auVar12._0_8_ = local_160;
          auVar12._16_8_ = uStack_150;
          auVar12._24_8_ = uStack_148;
          _local_380 = vsubps_avx(auVar13,auVar12);
          local_3a0._0_4_ = (float)uVar5;
          local_3a0._4_4_ = (float)((ulong)uVar5 >> 0x20);
          uStack_398._0_4_ = (float)uVar6;
          uStack_398._4_4_ = (float)((ulong)uVar6 >> 0x20);
          uStack_390._0_4_ = (float)uVar7;
          uStack_390._4_4_ = (float)((ulong)uVar7 >> 0x20);
          uStack_388._0_4_ = (float)uVar8;
          uStack_388._4_4_ = (float)((ulong)uVar8 >> 0x20);
          local_3e0 = (float)local_380._0_4_ + (float)local_3a0;
          fStack_3dc = (float)local_380._4_4_ + local_3a0._4_4_;
          fStack_3d8 = fStack_378 + (float)uStack_398;
          fStack_3d4 = fStack_374 + uStack_398._4_4_;
          fStack_3d0 = fStack_370 + (float)uStack_390;
          fStack_3cc = fStack_36c + uStack_390._4_4_;
          fStack_3c8 = fStack_368 + (float)uStack_388;
          fStack_3c4 = fStack_364 + uStack_388._4_4_;
          local_410 = local_7f0;
          local_440 = CONCAT44(local_340._4_4_ + fStack_35c,(float)local_340 + local_360);
          uStack_438 = CONCAT44(uStack_338._4_4_ + fStack_354,(float)uStack_338 + fStack_358);
          uStack_430 = CONCAT44(uStack_330._4_4_ + fStack_34c,(float)uStack_330 + fStack_350);
          uStack_428 = CONCAT44(uStack_328._4_4_ + fStack_344,(float)uStack_328 + fStack_348);
          *local_7f0 = local_440;
          local_7f0[1] = uStack_438;
          local_7f0[2] = uStack_430;
          local_7f0[3] = uStack_428;
          local_448 = local_7f0 + 4;
          local_480 = CONCAT44(local_340._4_4_ + fStack_3dc,(float)local_340 + local_3e0);
          uStack_478 = CONCAT44(uStack_338._4_4_ + fStack_3d4,(float)uStack_338 + fStack_3d8);
          uStack_470 = CONCAT44(uStack_330._4_4_ + fStack_3cc,(float)uStack_330 + fStack_3d0);
          uStack_468 = CONCAT44(uStack_328._4_4_ + fStack_3c4,(float)uStack_328 + fStack_3c8);
          *local_448 = local_480;
          local_7f0[5] = uStack_478;
          local_7f0[6] = uStack_470;
          local_7f0[7] = uStack_468;
          local_7f0 = (undefined8 *)((long)local_7f0 + (long)(local_5d4 << 3) * 4);
          local_3a0 = uVar5;
          uStack_398 = uVar6;
          uStack_390 = uVar7;
          uStack_388 = uVar8;
          local_340 = local_7c0[0x20];
          uStack_338 = local_7c0[0x21];
          uStack_330 = local_7c0[0x22];
          uStack_328 = uStack_6a8;
          local_320 = local_160;
          uStack_318 = uStack_158;
          uStack_310 = uStack_150;
          uStack_308 = uStack_148;
          local_2e0 = local_140;
          uStack_2d8 = uStack_138;
          uStack_2d0 = uStack_130;
          uStack_2c8 = uStack_128;
          local_2c0 = uVar1;
          uStack_2b8 = uVar2;
          uStack_2b0 = uVar3;
          uStack_2a8 = uVar4;
        }
      }
    }
    local_5b0 = &local_688;
    local_558 = local_5b0;
    if (local_680 != (int *)0x0) {
      local_55c = 0xffffffff;
      LOCK();
      local_560 = *local_680;
      *local_680 = *local_680 + -1;
      UNLOCK();
      if (local_560 == 1) {
        if (local_668 == (long *)0x0) {
          local_4d0 = local_688;
          if (local_688 != (void *)0x0) {
            free(local_688);
          }
        }
        else {
          (**(code **)(*local_668 + 0x18))(local_668,local_688);
        }
      }
    }
    local_688 = (void *)0x0;
    local_678 = 0;
    local_670 = 0;
    local_660 = 0;
    local_65c = 0;
    local_658 = 0;
    local_654 = 0;
    local_650 = 0;
    local_648 = 0;
    local_680 = (int *)0x0;
    local_5a0 = &local_640;
    local_578 = local_5a0;
    if (local_638 != (int *)0x0) {
      local_57c = 0xffffffff;
      LOCK();
      local_580 = *local_638;
      *local_638 = *local_638 + -1;
      UNLOCK();
      if (local_580 == 1) {
        if (local_620 == (long *)0x0) {
          local_4c0 = local_640;
          if (local_640 != (void *)0x0) {
            free(local_640);
          }
        }
        else {
          (**(code **)(*local_620 + 0x18))(local_620,local_640);
        }
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_transform_output_pack8_avx(const Mat& top_blob_tm, Mat& top_blob, const Mat& bias, const Option& opt)
{
    const int outw = top_blob.w;
    const int outh = top_blob.h;
    const int outch = top_blob.c;

    const int w_tiles = outw / 2;
    const int h_tiles = outh / 2;
    const int tiles = w_tiles * h_tiles;

    const float* biasptr = bias;

    // const float otm[2][4] = {
    //     {1.0f,  1.0f,  1.0f,  0.0f},
    //     {0.0f,  1.0f, -1.0f,  1.0f}
    // };

    // 0 = r00 + r01 + r02
    // 1 = r01 - r02 + r03

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        const Mat out0_tm = top_blob_tm.channel(p);
        Mat out0 = top_blob.channel(p);

        __m256 _bias0 = biasptr ? _mm256_loadu_ps(biasptr + p * 8) : _mm256_setzero_ps();

#ifdef _MSC_VER
        __declspec(align(32))
#else
        __attribute__((aligned(32)))
#endif
        float tmp[2][4][8];

        // tile
        for (int i = 0; i < h_tiles; i++)
        {
            for (int j = 0; j < w_tiles; j++)
            {
                const float* output0_tm_0 = (const float*)out0_tm + (i * w_tiles + j) * 8;
                const float* output0_tm_1 = output0_tm_0 + tiles * 8;
                const float* output0_tm_2 = output0_tm_0 + tiles * 8 * 2;
                const float* output0_tm_3 = output0_tm_0 + tiles * 8 * 3;

                float* output0 = out0.row(i * 2) + (j * 2) * 8;

                for (int m = 0; m < 4; m++)
                {
                    __m256 _out0tm0 = _mm256_load_ps(output0_tm_0);
                    __m256 _out0tm1 = _mm256_load_ps(output0_tm_1);
                    __m256 _out0tm2 = _mm256_load_ps(output0_tm_2);
                    __m256 _out0tm3 = _mm256_load_ps(output0_tm_3);

                    __m256 _tmp0m = _mm256_add_ps(_mm256_add_ps(_out0tm0, _out0tm1), _out0tm2);
                    __m256 _tmp1m = _mm256_add_ps(_mm256_sub_ps(_out0tm1, _out0tm2), _out0tm3);

#if defined(__GNUC__) && (__GNUC__ <= 4) && (__GNUC_MINOR__ < 6)
                    _mm256_storeu_ps(tmp[0][m], _tmp0m);
                    _mm256_storeu_ps(tmp[1][m], _tmp1m);
#else
                    _mm256_store_ps(tmp[0][m], _tmp0m);
                    _mm256_store_ps(tmp[1][m], _tmp1m);
#endif

                    output0_tm_0 += tiles * 8 * 4;
                    output0_tm_1 += tiles * 8 * 4;
                    output0_tm_2 += tiles * 8 * 4;
                    output0_tm_3 += tiles * 8 * 4;
                }

                for (int m = 0; m < 2; m++)
                {
#if defined(__GNUC__) && (__GNUC__ <= 4) && (__GNUC_MINOR__ < 6)
                    __m256 _tmp00 = _mm256_loadu_ps(tmp[m][0]);
                    __m256 _tmp01 = _mm256_loadu_ps(tmp[m][1]);
                    __m256 _tmp02 = _mm256_loadu_ps(tmp[m][2]);
                    __m256 _tmp03 = _mm256_loadu_ps(tmp[m][3]);
#else
                    __m256 _tmp00 = _mm256_load_ps(tmp[m][0]);
                    __m256 _tmp01 = _mm256_load_ps(tmp[m][1]);
                    __m256 _tmp02 = _mm256_load_ps(tmp[m][2]);
                    __m256 _tmp03 = _mm256_load_ps(tmp[m][3]);
#endif

                    __m256 _out00 = _mm256_add_ps(_bias0, _mm256_add_ps(_mm256_add_ps(_tmp00, _tmp01), _tmp02));
                    __m256 _out01 = _mm256_add_ps(_bias0, _mm256_add_ps(_mm256_sub_ps(_tmp01, _tmp02), _tmp03));

                    _mm256_store_ps(output0, _out00);
                    _mm256_store_ps(output0 + 8, _out01);

                    output0 += outw * 8;
                }
            }
        }
    }
}